

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

pid_t phosg::getpid_cached(void)

{
  if (cached_this_process_pid != 0) {
    return cached_this_process_pid;
  }
  if (atfork_handler_added == '\0') {
    pthread_atfork((__prepare *)0x0,(__parent *)0x0,clear_cached_pid_vars);
    atfork_handler_added = '\x01';
  }
  cached_this_process_pid = getpid();
  return cached_this_process_pid;
}

Assistant:

pid_t getpid_cached() {
  if (!cached_this_process_pid) {
    maybe_add_atfork_handler();
    cached_this_process_pid = getpid();
  }
  return cached_this_process_pid;
}